

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t uncompress_file(archive_read *a)

{
  wchar_t wVar1;
  wchar_t ret;
  archive_read *a_local;
  
  do {
    wVar1 = do_uncompress_file(a);
  } while (wVar1 == L'\xfffffff6');
  return wVar1;
}

Assistant:

static int uncompress_file(struct archive_read* a) {
	int ret;

	while(1) {
		/* Sometimes the uncompression function will return a
		 * 'retry' signal. If this will happen, we have to retry
		 * the function. */
		ret = do_uncompress_file(a);
		if(ret != ARCHIVE_RETRY)
			return ret;
	}
}